

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

void __thiscall CPU::CMP_AB_X(CPU *this)

{
  uint16_t uVar1;
  int iVar2;
  byte bVar3;
  
  this->cycles = 4;
  uVar1 = GetWord(this);
  this->cycles = this->cycles - 1;
  iVar2 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)(ushort)(this->X + uVar1));
  bVar3 = this->A - (byte)iVar2;
  (this->field_6).ps =
       bVar3 & 0x80 | (bVar3 == 0) * '\x02' | (byte)iVar2 <= this->A | (this->field_6).ps & 0x7c;
  return;
}

Assistant:

void CPU::CMP_AB_X()
{
    cycles = 4;
    uint8_t op = ReadByte(GetWord() + X);
    uint8_t res = A - op;
    C = (A >= op);
    Z = (A == op);
    N = (res & 0b10000000) > 0;
}